

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

long kwssys::SystemTools::CreationTime(string *filename)

{
  int iVar1;
  char *__file;
  stat fs;
  long ct;
  long local_a8;
  stat local_a0;
  long local_10;
  
  local_10 = 0;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,&local_a0);
  if (iVar1 == 0) {
    if (local_a0.st_ctim.tv_sec < 0) {
      local_a8 = 0;
    }
    else {
      local_a8 = local_a0.st_ctim.tv_sec;
    }
    local_10 = local_a8;
  }
  return local_10;
}

Assistant:

long int SystemTools::CreationTime(const std::string& filename)
{
  long int ct = 0;
#ifdef _WIN32
  WIN32_FILE_ATTRIBUTE_DATA fs;
  if (GetFileAttributesExW(Encoding::ToWindowsExtendedPath(filename).c_str(),
                           GetFileExInfoStandard, &fs) != 0) {
    ct = windows_filetime_to_posix_time(fs.ftCreationTime);
  }
#else
  struct stat fs;
  if (stat(filename.c_str(), &fs) == 0) {
    ct = fs.st_ctime >= 0 ? static_cast<long int>(fs.st_ctime) : 0;
  }
#endif
  return ct;
}